

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O1

void run(vw *vw)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vw *pvVar2;
  example *peVar3;
  ezexample ex;
  string local_238;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ezexample local_198;
  
  ezexample::ezexample(&local_198,vw,true,(vw *)0x0);
  ezexample::addns(&local_198,'s');
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^the_man","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^the","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^man","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  ezexample::addns(&local_198,'t');
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^un_homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^un","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"1:1","");
  peVar3 = local_198.ec;
  pvVar2 = local_198.vw_par_ref;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_1b8,local_1b8 + local_1b0);
  VW::parse_example_label(pvVar2,peVar3,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_198.example_changed_since_prediction = true;
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  ezexample::train(&local_198);
  ezexample::remns(&local_198);
  ezexample::addns(&local_198,'t');
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^le_homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^le","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"2:0","");
  peVar3 = local_198.ec;
  pvVar2 = local_198.vw_par_ref;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_1d8,local_1d8 + local_1d0);
  VW::parse_example_label(pvVar2,peVar3,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_198.example_changed_since_prediction = true;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  ezexample::train(&local_198);
  ezexample::finish(&local_198);
  ezexample::addns(&local_198,'s');
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^a_man","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^a","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^man","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  ezexample::addns(&local_198,'t');
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^un_homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^un","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"1:0","");
  peVar3 = local_198.ec;
  pvVar2 = local_198.vw_par_ref;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_1f8,local_1f8 + local_1f0);
  VW::parse_example_label(pvVar2,peVar3,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_198.example_changed_since_prediction = true;
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  ezexample::train(&local_198);
  ezexample::remns(&local_198);
  ezexample::addns(&local_198,'t');
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"p^le_homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^le","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"w^homme","");
  ezexample::addf(&local_198,&local_238,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"2:1","");
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_218,local_218 + local_210);
  VW::parse_example_label(local_198.vw_par_ref,local_198.ec,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_198.example_changed_since_prediction = true;
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  ezexample::train(&local_198);
  ezexample::finish(&local_198);
  ezexample::~ezexample(&local_198);
  return;
}

Assistant:

void run(vw*vw)
{ ezexample ex(vw, true);   // we're doing csoaa_ldf so we need multiline examples

  /// BEGIN FIRST MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^the_man")
  ("w^the")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:1");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:0");
  ex.train();

  // push it through VW for training
  ex.finish();

  /// BEGIN SECOND MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^a_man")
  ("w^a")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:0");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:1");
  ex.train();

  // push it through VW for training
  ex.finish();
}